

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int get_thread_siblings(int cpuid)

{
  int iVar1;
  FILE *__stream;
  uint uVar2;
  uint uVar3;
  char sep;
  int id0;
  int id1;
  char path [256];
  char local_141;
  uint local_140;
  uint local_13c;
  char local_138 [264];
  
  sprintf(local_138,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings",cpuid);
  sprintf(local_138,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list",cpuid);
  __stream = fopen(local_138,"rb");
  if (__stream == (FILE *)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    iVar1 = __isoc99_fscanf(__stream,"%d",&local_140);
    uVar3 = 0xffffffff;
    if (iVar1 == 1) {
      uVar3 = 1 << ((byte)local_140 & 0x1f);
      iVar1 = __isoc99_fscanf(__stream,"%c%d",&local_141,&local_13c);
      if (iVar1 == 2) {
        do {
          uVar2 = 1 << ((byte)local_13c & 0x1f);
          if (local_141 != ',') {
            uVar2 = 0;
          }
          uVar3 = uVar2 | uVar3;
          if ((int)local_140 < (int)local_13c && local_141 == '-') {
            do {
              local_140 = local_140 + 1;
              uVar3 = uVar3 | 1 << (local_140 & 0x1f);
            } while (local_140 != local_13c);
          }
          local_140 = local_13c;
          iVar1 = __isoc99_fscanf(__stream,"%c%d",&local_141,&local_13c);
        } while (iVar1 == 2);
      }
    }
    fclose(__stream);
  }
  return uVar3;
}

Assistant:

static int get_thread_siblings(int cpuid)
{
    char path[256];
    sprintf(path, "/sys/devices/system/cpu/cpu%d/topology/thread_siblings", cpuid);

    FILE* fp = 0; //fopen(path, "rb");
    if (fp)
    {
        int thread_siblings = -1;
        int nscan = fscanf(fp, "%x", &thread_siblings);
        if (nscan != 1)
        {
            // ignore
        }

        fclose(fp);

        return thread_siblings;
    }

    // second try, parse from human-readable thread_siblings_list
    sprintf(path, "/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list", cpuid);

    fp = fopen(path, "rb");
    if (fp)
    {
        int thread_siblings = -1;

        int id0;
        char sep;
        int id1;

        int nscan = fscanf(fp, "%d", &id0);
        if (nscan == 1)
        {
            thread_siblings = (1 << id0);

            while (fscanf(fp, "%c%d", &sep, &id1) == 2)
            {
                if (sep == ',')
                {
                    thread_siblings |= (1 << id1);
                }
                if (sep == '-' && id0 < id1)
                {
                    for (int i = id0 + 1; i <= id1; i++)
                    {
                        thread_siblings |= (1 << i);
                    }
                }

                id0 = id1;
            }
        }
        else
        {
            // ignore
        }

        fclose(fp);

        return thread_siblings;
    }

    return -1;
}